

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGeneratorMocUic.cxx
# Opt level: O0

void __thiscall
cmQtAutoGeneratorMocUic::WorkerSwapJob(cmQtAutoGeneratorMocUic *this,JobHandleT *jobHandle)

{
  bool bVar1;
  uv_async_ptr *this_00;
  reference pvVar2;
  size_t __n;
  void *__buf;
  int __fd;
  int in_R8D;
  bool local_51;
  undefined1 local_30 [8];
  unique_lock<std::mutex> jobsLock;
  bool jobProcessed;
  JobHandleT *jobHandle_local;
  cmQtAutoGeneratorMocUic *this_local;
  mutex *__m;
  
  jobsLock._15_1_ = std::unique_ptr::operator_cast_to_bool((unique_ptr *)jobHandle);
  if ((bool)jobsLock._15_1_) {
    std::
    unique_ptr<cmQtAutoGeneratorMocUic::JobT,_std::default_delete<cmQtAutoGeneratorMocUic::JobT>_>::
    reset(jobHandle,(pointer)0x0);
  }
  __m = &this->JobsMutex_;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_30,__m);
  __fd = (int)__m;
  if ((jobsLock._15_1_ & 1) != 0) {
    __n = this->JobsRemain_ - 1;
    this->JobsRemain_ = __n;
    if (this->JobsRemain_ == 0) {
      this_00 = cmQtAutoGenerator::UVRequest(&this->super_cmQtAutoGenerator);
      ::cm::uv_async_ptr::send(this_00,__fd,__buf,__n,in_R8D);
    }
  }
  while( true ) {
    local_51 = false;
    if ((this->JobThreadsAbort_ & 1U) == 0) {
      local_51 = std::
                 deque<std::unique_ptr<cmQtAutoGeneratorMocUic::JobT,_std::default_delete<cmQtAutoGeneratorMocUic::JobT>_>,_std::allocator<std::unique_ptr<cmQtAutoGeneratorMocUic::JobT,_std::default_delete<cmQtAutoGeneratorMocUic::JobT>_>_>_>
                 ::empty(&this->JobQueue_);
    }
    if (local_51 == false) break;
    std::condition_variable::wait((unique_lock *)&this->JobsConditionRead_);
  }
  if (((this->JobThreadsAbort_ & 1U) == 0) &&
     (bVar1 = std::
              deque<std::unique_ptr<cmQtAutoGeneratorMocUic::JobT,_std::default_delete<cmQtAutoGeneratorMocUic::JobT>_>,_std::allocator<std::unique_ptr<cmQtAutoGeneratorMocUic::JobT,_std::default_delete<cmQtAutoGeneratorMocUic::JobT>_>_>_>
              ::empty(&this->JobQueue_), !bVar1)) {
    pvVar2 = std::
             deque<std::unique_ptr<cmQtAutoGeneratorMocUic::JobT,_std::default_delete<cmQtAutoGeneratorMocUic::JobT>_>,_std::allocator<std::unique_ptr<cmQtAutoGeneratorMocUic::JobT,_std::default_delete<cmQtAutoGeneratorMocUic::JobT>_>_>_>
             ::front(&this->JobQueue_);
    std::
    unique_ptr<cmQtAutoGeneratorMocUic::JobT,_std::default_delete<cmQtAutoGeneratorMocUic::JobT>_>::
    operator=(jobHandle,pvVar2);
    std::
    deque<std::unique_ptr<cmQtAutoGeneratorMocUic::JobT,_std::default_delete<cmQtAutoGeneratorMocUic::JobT>_>,_std::allocator<std::unique_ptr<cmQtAutoGeneratorMocUic::JobT,_std::default_delete<cmQtAutoGeneratorMocUic::JobT>_>_>_>
    ::pop_front(&this->JobQueue_);
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_30);
  return;
}

Assistant:

void cmQtAutoGeneratorMocUic::WorkerSwapJob(JobHandleT& jobHandle)
{
  bool const jobProcessed(jobHandle);
  if (jobProcessed) {
    jobHandle.reset();
  }
  {
    std::unique_lock<std::mutex> jobsLock(JobsMutex_);
    // Reduce the remaining job count and notify the libuv loop
    // when all jobs are done
    if (jobProcessed) {
      --JobsRemain_;
      if (JobsRemain_ == 0) {
        UVRequest().send();
      }
    }
    // Wait for new jobs
    while (!JobThreadsAbort_ && JobQueue_.empty()) {
      JobsConditionRead_.wait(jobsLock);
    }
    // Try to pick up a new job handle
    if (!JobThreadsAbort_ && !JobQueue_.empty()) {
      jobHandle = std::move(JobQueue_.front());
      JobQueue_.pop_front();
    }
  }
}